

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void * mpc_export(mpc_input_t *i,void *p)

{
  int iVar1;
  char *q;
  void *p_local;
  mpc_input_t *i_local;
  
  iVar1 = mpc_mem_ptr(i,p);
  i_local = (mpc_input_t *)p;
  if (iVar1 != 0) {
    i_local = (mpc_input_t *)malloc(0x40);
    memcpy(i_local,p,0x40);
    mpc_free(i,p);
  }
  return i_local;
}

Assistant:

static void *mpc_export(mpc_input_t *i, void *p) {
  char *q = NULL;
  if (!mpc_mem_ptr(i, p)) { return p; }
  q = malloc(sizeof(mpc_mem_t));
  memcpy(q, p, sizeof(mpc_mem_t));
  mpc_free(i, p);
  return q;
}